

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpBin::parse(CTcPrsOpBin *this)

{
  CTcTokenizer *pCVar1;
  int iVar2;
  tc_toktyp_t tVar3;
  tc_toktyp_t tVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsOpBin *in_RDI;
  CTcPrsNode *const_tree;
  CTcPrsNode *rhs;
  CTcPrsNode *lhs;
  CTcTokenizer *in_stack_ffffffffffffffd8;
  CTcTokenizer *local_18;
  CTcTokenizer *local_8;
  undefined4 extraout_var_00;
  
  iVar2 = (**in_RDI->left_->_vptr_CTcPrsOp)();
  pCVar1 = (CTcTokenizer *)CONCAT44(extraout_var,iVar2);
  if ((CTcTokenizer *)CONCAT44(extraout_var,iVar2) == (CTcTokenizer *)0x0) {
    local_8 = (CTcTokenizer *)0x0;
  }
  else {
    while( true ) {
      local_18 = pCVar1;
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x24fa88);
      tVar4 = get_op_tok(in_RDI);
      if (tVar3 != tVar4) break;
      CTcTokenizer::next(in_stack_ffffffffffffffd8);
      iVar2 = (**in_RDI->right_->_vptr_CTcPrsOp)();
      lVar5 = CONCAT44(extraout_var_00,iVar2);
      if (lVar5 == 0) {
        return (CTcPrsNode *)0x0;
      }
      iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[2])(in_RDI,local_18,lVar5);
      in_stack_ffffffffffffffd8 = (CTcTokenizer *)CONCAT44(extraout_var_01,iVar2);
      pCVar1 = in_stack_ffffffffffffffd8;
      if (in_stack_ffffffffffffffd8 == (CTcTokenizer *)0x0) {
        iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[1])(in_RDI,local_18,lVar5);
        pCVar1 = (CTcTokenizer *)CONCAT44(extraout_var_02,iVar2);
      }
    }
    local_8 = local_18;
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpBin::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find our operator */
    for (;;)
    {
        /* check my operator */
        if (G_tok->cur() == get_op_tok())
        {
            /* skip the matching token */
            G_tok->next();
            
            /* parse the right-hand side */
            CTcPrsNode *rhs = right_->parse();
            if (rhs == 0)
                return 0;

            /* try folding our subnodes into a constant value, if possible */
            CTcPrsNode *const_tree = eval_constant(lhs, rhs);

            /* 
             *   if we couldn't calculate a constant value, build the tree
             *   normally 
             */
            if (const_tree == 0)
            {
                /* 
                 *   Build my tree, then proceed to parse any additional
                 *   occurrences of our operator, with the result of
                 *   applying this occurrence of the operator as the
                 *   left-hand side of the new operator.  
                 */
                lhs = build_tree(lhs, rhs);
            }
            else
            {
                /* we got a constant value - use it as the result directly */
                lhs = const_tree;
            }
        }
        else
        {
            /* 
             *   it's not my operator - return what we thought might have
             *   been our left-hand side 
             */
            return lhs;
        }
    }
}